

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O0

void labelstat(LexState *ls,TString *label,int line)

{
  FuncState *fs_00;
  int iVar1;
  int iVar2;
  Labellist *ll_00;
  int l;
  Labellist *ll;
  FuncState *fs;
  int line_local;
  TString *label_local;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  ll_00 = &ls->dyd->label;
  checkrepeated(fs_00,ll_00,label);
  checknext(ls,0x11d);
  iVar1 = newlabelentry(ls,ll_00,label,line,fs_00->pc);
  skipnoopstat(ls);
  iVar2 = block_follow(ls,0);
  if (iVar2 != 0) {
    ll_00->arr[iVar1].nactvar = fs_00->bl->nactvar;
  }
  findgotos(ls,ll_00->arr + iVar1);
  return;
}

Assistant:

static void labelstat (LexState *ls, TString *label, int line) {
  /* label -> '::' NAME '::' */
  FuncState *fs = ls->fs;
  Labellist *ll = &ls->dyd->label;
  int l;  /* index of new label being created */
  checkrepeated(fs, ll, label);  /* check for repeated labels */
  checknext(ls, TK_DBCOLON);  /* skip double colon */
  /* create new entry for this label */
  l = newlabelentry(ls, ll, label, line, fs->pc);
  skipnoopstat(ls);  /* skip other no-op statements */
  if (block_follow(ls, 0)) {  /* label is last no-op statement in the block? */
    /* assume that locals are already out of scope */
    ll->arr[l].nactvar = fs->bl->nactvar;
  }
  findgotos(ls, &ll->arr[l]);
}